

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall crnlib::crn_comp::optimize_alpha(crn_comp *this)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  endpoint_indices_details *peVar9;
  void *p;
  ushort uVar10;
  uint uVar11;
  long *pData_ptr;
  executable_task *pObj;
  uint temp_4;
  uint uVar12;
  ulong uVar13;
  undefined2 uVar14;
  uint uVar15;
  unsigned_short *temp_3;
  ulong uVar17;
  unsigned_short *puVar18;
  unsigned_short *puVar19;
  uint uVar20;
  uint uVar21;
  uint temp_1;
  uint uVar22;
  uchar *temp;
  uchar *puVar23;
  uchar *puVar24;
  uint uVar25;
  undefined4 *puVar26;
  uint uVar27;
  uint uVar28;
  uint *puVar29;
  uint i;
  long lVar30;
  uint64 data;
  vector<unsigned_int> sum;
  vector<unsigned_int> hist;
  vector<crnlib::optimize_alpha_params::unpacked_endpoint> unpacked_endpoints;
  result remapping_trial [4];
  elemental_vector local_128;
  elemental_vector local_118;
  elemental_vector local_108;
  undefined8 uStack_f8;
  undefined8 local_f0;
  executable_task local_e8;
  undefined8 local_e0;
  uint local_d8 [2];
  undefined8 auStack_d0 [20];
  ulong uVar16;
  
  uVar25 = (this->m_alpha_endpoints).m_size;
  local_e0 = (ulong)uVar25;
  uVar10 = (ushort)uVar25;
  local_118.m_p = (void *)0x0;
  local_118.m_size = 0;
  local_118.m_capacity = 0;
  if ((ulong)uVar10 != 0) {
    uVar15 = (uVar25 & 0xffff) * (uVar25 & 0xffff);
    elemental_vector::increase_capacity(&local_118,uVar15,uVar15 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_118._8_8_ & 0xffffffff) * 4 + (long)local_118.m_p),0,
           (ulong)(uVar15 - local_118.m_size) << 2);
    local_118.m_size = uVar15;
  }
  local_128.m_p = (void *)0x0;
  local_128.m_size = 0;
  local_128.m_capacity = 0;
  uVar27 = uVar25 & 0xffff;
  uVar28 = uVar25 & 0xffff;
  if (uVar27 != 0) {
    elemental_vector::increase_capacity(&local_128,uVar27,uVar27 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_128._8_8_ & 0xffffffff) * 4 + (long)local_128.m_p),0,
           (ulong)(uVar28 - local_128.m_size) << 2);
    local_128._8_8_ = CONCAT44(local_128.m_capacity,uVar25) & 0xffffffff0000ffff;
  }
  if ((this->m_endpoint_indices).m_size != 0) {
    bVar2 = this->m_has_comp[1];
    bVar3 = this->m_has_comp[2];
    uVar13 = 0;
    uVar17 = 0;
    uVar27 = 0;
    do {
      peVar9 = (this->m_endpoint_indices).m_p;
      uVar4 = peVar9[uVar13].field_0.field_0.alpha0;
      uVar20 = (uint)peVar9[uVar13].field_0.field_0.alpha1;
      if (peVar9[uVar13].reference == '\0') {
        if (bVar2 != false) {
          uVar22 = (uint)uVar17;
          if (uVar22 != uVar4) {
            piVar1 = (int *)((long)local_118.m_p + (ulong)(uVar28 * uVar4 + uVar22) * 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)local_118.m_p + (ulong)(uVar22 * uVar28 + (uint)uVar4) * 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)local_128.m_p + (ulong)(uint)uVar4 * 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)local_128.m_p + uVar17 * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        if ((bVar3 != false) && (uVar27 != uVar20)) {
          piVar1 = (int *)((long)local_118.m_p + (ulong)(uVar28 * uVar20 + uVar27) * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_118.m_p + (ulong)(uVar27 * uVar28 + uVar20) * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_128.m_p + (ulong)uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_128.m_p + (ulong)uVar27 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar13 = uVar13 + 1;
      uVar17 = (ulong)uVar4;
      uVar27 = uVar20;
    } while (uVar13 < (this->m_endpoint_indices).m_size);
  }
  uVar27 = 0;
  if (uVar28 == 0) {
    uVar14 = 0;
  }
  else {
    uVar13 = 0;
    uVar17 = 0;
    do {
      uVar28 = *(uint *)((long)local_128.m_p + uVar13 * 4);
      uVar16 = uVar13 & 0xffffffff;
      if (uVar28 <= uVar27) {
        uVar16 = uVar17;
      }
      uVar14 = (undefined2)uVar16;
      if (uVar27 <= uVar28) {
        uVar27 = uVar28;
      }
      uVar13 = uVar13 + 1;
      uVar17 = uVar16;
    } while (uVar10 != uVar13);
  }
  local_108.m_p = (void *)0x0;
  local_108.m_size = 0;
  local_108.m_capacity = 0;
  uVar27 = uVar25 & 0xffff;
  if (uVar27 != 0) {
    elemental_vector::increase_capacity(&local_108,uVar27,uVar27 == 1,2,(object_mover)0x0,false);
    local_108._8_8_ = CONCAT44(local_108.m_capacity,uVar25) & 0xffffffff0000ffff;
    lVar30 = 0;
    do {
      uVar15 = dxt5_block::unpack_endpoint((this->m_alpha_endpoints).m_p[lVar30],0);
      *(char *)((long)local_108.m_p + lVar30 * 2) = (char)uVar15;
      uVar15 = dxt5_block::unpack_endpoint((this->m_alpha_endpoints).m_p[lVar30],1);
      *(char *)((long)local_108.m_p + lVar30 * 2 + 1) = (char)uVar15;
      lVar30 = lVar30 + 1;
    } while ((ushort)lVar30 < uVar10);
  }
  lVar30 = 0;
  do {
    *(undefined8 *)((long)auStack_d0 + lVar30 + 8) = 0;
    *(undefined8 *)((long)auStack_d0 + lVar30 + 0x10) = 0;
    *(undefined8 *)((long)local_d8 + lVar30) = 0;
    *(undefined8 *)((long)auStack_d0 + lVar30) = 0;
    lVar30 = lVar30 + 0x28;
  } while (lVar30 != 0xa0);
  local_f0 = &this->m_task_pool;
  puVar26 = &DAT_001ba5e0;
  puVar29 = local_d8;
  data = 0;
  local_e8._vptr_executable_task = (_func_int **)&PTR_execute_task_001de8a8;
  do {
    pData_ptr = (long *)crnlib_malloc(0x20);
    *pData_ptr = (long)local_108.m_p;
    pData_ptr[1] = (long)local_118.m_p;
    *(short *)(pData_ptr + 2) = (short)local_e0;
    *(undefined2 *)((long)pData_ptr + 0x12) = uVar14;
    *(undefined4 *)((long)pData_ptr + 0x14) = *puVar26;
    pData_ptr[3] = (long)puVar29;
    pObj = (executable_task *)crnlib_malloc(0x28);
    pObj->_vptr_executable_task = local_e8._vptr_executable_task;
    pObj[1]._vptr_executable_task = (_func_int **)this;
    pObj[2]._vptr_executable_task = (_func_int **)optimize_alpha_endpoints_task;
    pObj[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
    task_pool::queue_task(local_f0,pObj,data,pData_ptr);
    data = data + 1;
    puVar26 = puVar26 + 1;
    puVar29 = puVar29 + 10;
  } while (data != 4);
  task_pool::join(local_f0);
  uVar15 = (this->m_packed_alpha_endpoints).m_size;
  uVar21 = (this->m_packed_alpha_endpoints).m_capacity;
  uVar12 = this->m_endpoint_remaping[1].m_size;
  uVar11 = this->m_endpoint_remaping[1].m_capacity;
  uVar25 = 0xffffffff;
  lVar30 = 0x20;
  puVar18 = this->m_endpoint_remaping[1].m_p;
  puVar23 = (this->m_packed_alpha_endpoints).m_p;
  do {
    uVar27 = *(uint *)((long)local_d8 + lVar30);
    puVar19 = puVar18;
    puVar24 = puVar23;
    if (uVar27 < uVar25) {
      puVar24 = *(uchar **)((long)&local_e8._vptr_executable_task + lVar30);
      (this->m_packed_alpha_endpoints).m_p = puVar24;
      *(uchar **)((long)&local_e8._vptr_executable_task + lVar30) = puVar23;
      uVar5 = *(uint *)((long)local_d8 + lVar30 + -8);
      (this->m_packed_alpha_endpoints).m_size = uVar5;
      *(uint *)((long)local_d8 + lVar30 + -8) = uVar15;
      uVar6 = *(uint *)((long)local_d8 + lVar30 + -4);
      (this->m_packed_alpha_endpoints).m_capacity = uVar6;
      *(uint *)((long)local_d8 + lVar30 + -4) = uVar21;
      puVar19 = *(unsigned_short **)((long)&uStack_f8 + lVar30);
      this->m_endpoint_remaping[1].m_p = puVar19;
      *(unsigned_short **)((long)&uStack_f8 + lVar30) = puVar18;
      uVar7 = *(uint *)((long)&local_f0 + lVar30);
      this->m_endpoint_remaping[1].m_size = uVar7;
      *(uint *)((long)&local_f0 + lVar30) = uVar12;
      uVar8 = *(uint *)((long)&local_f0 + lVar30 + 4);
      this->m_endpoint_remaping[1].m_capacity = uVar8;
      *(uint *)((long)&local_f0 + lVar30 + 4) = uVar11;
      uVar15 = uVar5;
      uVar21 = uVar6;
      uVar12 = uVar7;
      uVar11 = uVar8;
      uVar25 = uVar27;
    }
    lVar30 = lVar30 + 0x28;
    puVar18 = puVar19;
    puVar23 = puVar24;
  } while (lVar30 != 0xc0);
  lVar30 = 0x78;
  do {
    p = *(void **)((long)auStack_d0 + lVar30 + 8);
    if (p != (void *)0x0) {
      crnlib_free(p);
    }
    if (*(void **)((long)local_d8 + lVar30) != (void *)0x0) {
      crnlib_free(*(void **)((long)local_d8 + lVar30));
    }
    lVar30 = lVar30 + -0x28;
  } while (lVar30 != -0x28);
  if (local_108.m_p != (void *)0x0) {
    crnlib_free(local_108.m_p);
  }
  if (local_128.m_p != (void *)0x0) {
    crnlib_free(local_128.m_p);
  }
  if (local_118.m_p != (void *)0x0) {
    crnlib_free(local_118.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha() {
  uint16 n = m_alpha_endpoints.size();
  crnlib::vector<uint> hist(n * n);
  crnlib::vector<uint> sum(n);
  bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
  for (uint i0, i1, i0_prev = 0, i1_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i0_prev = i0, i1_prev = i1) {
    i0 = m_endpoint_indices[b].alpha0;
    i1 = m_endpoint_indices[b].alpha1;    
    if (!m_endpoint_indices[b].reference) {
      if (hasAlpha0 && i0 != i0_prev) {
        hist[i0 * n + i0_prev]++;
        hist[i0_prev * n + i0]++;
        sum[i0]++;
        sum[i0_prev]++;
      }
      if (hasAlpha1 && i1 != i1_prev) {
        hist[i1 * n + i1_prev]++;
        hist[i1_prev * n + i1]++;
        sum[i1]++;
        sum[i1_prev]++;
      }
    }
  }
  uint16 selected = 0;
  uint best_sum = 0;
  for (uint16 i = 0; i < n; i++) {
    if (best_sum < sum[i]) {
      best_sum = sum[i];
      selected = i;
    }
  }
  crnlib::vector<optimize_alpha_params::unpacked_endpoint> unpacked_endpoints(n);
  for (uint16 i = 0; i < n; i++) {
    unpacked_endpoints[i].low = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 0);
    unpacked_endpoints[i].high = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 1);
  }

  optimize_alpha_params::result remapping_trial[4];
  float weights[4] = {0, 0, 1.0f / 6.0f, 0.5f};
  for (uint i = 0; i < 4; i++) {
    optimize_alpha_params* pParams = crnlib_new<optimize_alpha_params>();
    pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
    pParams->hist = hist.get_ptr();
    pParams->n = n;
    pParams->selected = selected;
    pParams->weight = weights[i];
    pParams->pResult = remapping_trial + i;
    m_task_pool.queue_object_task(this, &crn_comp::optimize_alpha_endpoints_task, i, pParams);
  }
  m_task_pool.join();

  for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++) {
    if (remapping_trial[i].total_bits < best_bits) {
      m_packed_alpha_endpoints.swap(remapping_trial[i].packed_endpoints);
      m_endpoint_remaping[cAlpha0].swap(remapping_trial[i].endpoint_remapping);
      best_bits = remapping_trial[i].total_bits;
    }
  }
}